

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void AnalyzeClassElements
               (ExpressionContext *ctx,ExprClassDefinition *classDefinition,SynClassElements *syntax
               )

{
  SynClassElements *syntax_local;
  ExprClassDefinition *classDefinition_local;
  ExpressionContext *ctx_local;
  
  AnalyzeClassBaseElements(ctx,classDefinition,syntax);
  anon_unknown.dwarf_8df1c::FinalizeAlignment(&classDefinition->classType->super_TypeStruct);
  if (((classDefinition->classType->completed ^ 0xffU) & 1) == 0) {
    __assert_fail("!classDefinition->classType->completed",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x295b,
                  "void AnalyzeClassElements(ExpressionContext &, ExprClassDefinition *, SynClassElements *)"
                 );
  }
  classDefinition->classType->completed = true;
  if (0xffff < (classDefinition->classType->super_TypeStruct).super_TypeBase.size) {
    anon_unknown.dwarf_8df1c::Stop
              (ctx,&syntax->super_SynBase,"ERROR: class size cannot exceed 65535 bytes");
  }
  CreateDefaultClassMembers(ctx,&syntax->super_SynBase,classDefinition);
  AnalyzeClassFunctionElements(ctx,classDefinition,syntax);
  return;
}

Assistant:

void AnalyzeClassElements(ExpressionContext &ctx, ExprClassDefinition *classDefinition, SynClassElements *syntax)
{
	AnalyzeClassBaseElements(ctx, classDefinition, syntax);

	FinalizeAlignment(classDefinition->classType);

	assert(!classDefinition->classType->completed);

	classDefinition->classType->completed = true;

	if(classDefinition->classType->size >= 64 * 1024)
		Stop(ctx, syntax, "ERROR: class size cannot exceed 65535 bytes");

	CreateDefaultClassMembers(ctx, syntax, classDefinition);

	AnalyzeClassFunctionElements(ctx, classDefinition, syntax);
}